

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-util.h
# Opt level: O2

string * __thiscall
wabt::operator+[abi_cxx11_(string *__return_storage_ptr__,wabt *this,string_view x,string_view y)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__,x._M_len);
  std::__cxx11::string::append((char *)__return_storage_ptr__,y._M_len);
  return __return_storage_ptr__;
}

Assistant:

inline std::string operator+(std::string_view x, std::string_view y) {
  std::string s;
  s.reserve(x.size() + y.size());
  s.append(x.data(), x.size());
  s.append(y.data(), y.size());
  return s;
}